

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

bool __thiscall c4::yml::Parser::_maybe_set_indentation_from_anchor_or_tag(Parser *this)

{
  bool bVar1;
  long lVar2;
  
  if ((((this->m_key_anchor).len != 0) && (lVar2 = 0xa48, (this->m_key_anchor).str != (char *)0x0))
     || ((bVar1 = false, (this->m_key_tag).len != 0 &&
         (lVar2 = 0x9f8, (this->m_key_tag).str != (char *)0x0)))) {
    this->m_state->indref = *(size_t *)((long)(this->m_stack).m_buf + lVar2 + -0x38);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

C4_ALWAYS_INLINE C4_PURE bool   not_empty() const noexcept { return (len != 0 && str != nullptr); }